

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestWriterTestdropNullPlaceholders::runTestCase(TestWriterTestdropNullPlaceholders *this)

{
  bool bVar1;
  char *in_RCX;
  Value nullValue;
  FastWriter writer;
  undefined1 local_90 [72];
  FastWriter local_48;
  
  Json::FastWriter::FastWriter(&local_48);
  Json::Value::Value((Value *)(local_90 + 0x20),nullValue);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_90,(int)&local_48,local_90 + 0x20,(size_t)in_RCX);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"null\n");
  std::__cxx11::string::~string((string *)local_90);
  if (!bVar1) {
    in_RCX = "writer.write(nullValue) == \"null\\n\"";
    JsonTest::TestResult::addFailure
              ((this->super_WriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x66d,"writer.write(nullValue) == \"null\\n\"");
  }
  Json::FastWriter::dropNullPlaceholders(&local_48);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_90,(int)&local_48,local_90 + 0x20,(size_t)in_RCX);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"\n");
  std::__cxx11::string::~string((string *)local_90);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_WriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x670,"writer.write(nullValue) == \"\\n\"");
  }
  Json::Value::~Value((Value *)(local_90 + 0x20));
  Json::FastWriter::~FastWriter(&local_48);
  return;
}

Assistant:

JSONTEST_FIXTURE(WriterTest, dropNullPlaceholders) {
  Json::FastWriter writer;
  Json::Value nullValue;
  JSONTEST_ASSERT(writer.write(nullValue) == "null\n");

  writer.dropNullPlaceholders();
  JSONTEST_ASSERT(writer.write(nullValue) == "\n");
}